

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O2

void Aig_ManDfsAll_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  uint uVar2;
  long lStack_20;
  
  if (pObj->TravId == p->nTravIds) {
    return;
  }
  pObj->TravId = p->nTravIds;
  uVar1 = (uint)*(undefined8 *)&pObj->field_0x18;
  uVar2 = uVar1 & 7;
  if (uVar2 != 2) {
    if (uVar2 == 3) {
      lStack_20 = 8;
    }
    else {
      if ((uVar1 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDfs.c"
                      ,0xc5,"void Aig_ManDfsAll_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
      }
      Aig_ManDfsAll_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vNodes);
      lStack_20 = 0x10;
    }
    Aig_ManDfsAll_rec(p,(Aig_Obj_t *)
                        (*(ulong *)((long)&pObj->field_0 + lStack_20) & 0xfffffffffffffffe),vNodes);
  }
  Vec_PtrPush(vNodes,pObj);
  return;
}

Assistant:

void Aig_ManDfsAll_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_PtrPush( vNodes, pObj );
        return;
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        Aig_ManDfsAll_rec( p, Aig_ObjFanin0(pObj), vNodes );
        Vec_PtrPush( vNodes, pObj );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    Aig_ManDfsAll_rec( p, Aig_ObjFanin0(pObj), vNodes );
    Aig_ManDfsAll_rec( p, Aig_ObjFanin1(pObj), vNodes );
    Vec_PtrPush( vNodes, pObj );
}